

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool check_single(char *chesses,int row,int col,int diff_row,int diff_col)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int row2;
  uint uVar6;
  
  iVar4 = row - diff_row;
  iVar5 = col - diff_col;
  uVar2 = 5;
  while ((((uVar2 != 9 && (0xfffffff0 < iVar4 - 0x10U)) && (0xfffffff0 < iVar5 - 0x10U)) &&
         (bVar1 = check_color(chesses,row,col,iVar4,iVar5), bVar1))) {
    uVar2 = uVar2 + 1;
    iVar4 = iVar4 - diff_row;
    iVar5 = iVar5 - diff_col;
  }
  row2 = diff_row + row;
  iVar5 = diff_col + row;
  uVar6 = uVar2 - 4;
  iVar4 = 0;
  do {
    uVar3 = uVar2;
    if (iVar4 == 4) {
LAB_00106527:
      return 4 < uVar3;
    }
    if ((row2 - 0x10U < 0xfffffff1) || (iVar5 - 0x10U < 0xfffffff1)) {
      uVar3 = (uVar2 + iVar4) - 4;
      goto LAB_00106527;
    }
    bVar1 = check_color(chesses,row,col,row2,iVar5);
    uVar3 = uVar6;
    if (!bVar1) goto LAB_00106527;
    uVar6 = uVar6 + 1;
    iVar4 = iVar4 + 1;
    row2 = row2 + diff_row;
    iVar5 = iVar5 + diff_col;
  } while( true );
}

Assistant:

bool check_single(char chesses[], int row, int col, int diff_row, int diff_col) {
    int link_num = 1;
    for (int i = 1; i < 5; i++) {
        int tmp_row = row - diff_row * i;
        int tmp_col = col - diff_col * i;
        if (tmp_row <= 0 || tmp_row > 15 || tmp_col <= 0 || tmp_col > 15) {
            break;
        }
        if (!check_color(chesses, row, col, tmp_row, tmp_col)) {
            break; 
        }
        link_num += 1;
    }

    for (int i = 1; i < 5; i++) {
        int tmp_row = row + diff_row * i;
        int tmp_col = row + diff_col * i;
        if (tmp_row <= 0 || tmp_row > 15 || tmp_col <= 0 || tmp_col > 15) {
            break;
        }
        if (!check_color(chesses, row, col, tmp_row, tmp_col)) {
            break;
        }
        link_num += 1;
    }
    return link_num >= 5;
}